

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_AddFalseToObject(cJSON *object,char *name)

{
  cJSON_bool cVar1;
  cJSON *false_item;
  char *name_local;
  cJSON *object_local;
  
  object_local = cJSON_CreateFalse();
  cVar1 = add_item_to_object(object,name,object_local,&global_hooks,0);
  if (cVar1 == 0) {
    cJSON_Delete(object_local);
    object_local = (cJSON *)0x0;
  }
  return object_local;
}

Assistant:

CJSON_PUBLIC(cJSON*) cJSON_AddFalseToObject(cJSON * const object, const char * const name)
{
    cJSON *false_item = cJSON_CreateFalse();
    if (add_item_to_object(object, name, false_item, &global_hooks, false))
    {
        return false_item;
    }

    cJSON_Delete(false_item);
    return NULL;
}